

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_sha2.c
# Opt level: O0

void cmSHA512_Internal_Last(SHA_CTX *context)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  sha_word64 tmp_1;
  sha_word64 tmp;
  uint usedspace;
  SHA_CTX *context_local;
  
  uVar2 = (context->s512).bitcount[0] >> 3;
  uVar1 = (uint)uVar2 & 0x7f;
  uVar3 = (context->s512).bitcount[0] >> 0x20 | (context->s512).bitcount[0] << 0x20;
  uVar3 = (uVar3 & 0xff00ff00ff00ff00) >> 8 | (uVar3 & 0xff00ff00ff00ff) << 8;
  (context->s512).bitcount[0] =
       (uVar3 & 0xffff0000ffff0000) >> 0x10 | (uVar3 & 0xffff0000ffff) << 0x10;
  uVar3 = (context->s512).bitcount[1] >> 0x20 | (context->s512).bitcount[1] << 0x20;
  uVar3 = (uVar3 & 0xff00ff00ff00ff00) >> 8 | (uVar3 & 0xff00ff00ff00ff) << 8;
  (context->s512).bitcount[1] =
       (uVar3 & 0xffff0000ffff0000) >> 0x10 | (uVar3 & 0xffff0000ffff) << 0x10;
  if ((uVar2 & 0x7f) == 0) {
    memset((context->s1).buffer + 0x30,0,0x70);
    (context->s1).buffer[0x30] = 0x80;
  }
  else {
    uVar4 = uVar1 + 1;
    *(undefined1 *)((long)context + (ulong)uVar1 + 0x50) = 0x80;
    if (uVar4 < 0x71) {
      memset((void *)((long)context + (ulong)uVar4 + 0x50),0,(ulong)(0x70 - uVar4));
    }
    else {
      if (uVar4 < 0x80) {
        memset((void *)((long)context + (ulong)uVar4 + 0x50),0,(ulong)(0x80 - uVar4));
      }
      cmSHA512_Internal_Transform(context,(sha_word64 *)((context->s1).buffer + 0x30));
      memset((context->s1).buffer + 0x30,0,0x70);
    }
  }
  *(cm_sha2_uint64_t *)((context->s512).buffer + 0x70) = (context->s512).bitcount[1];
  *(cm_sha2_uint64_t *)((context->s512).buffer + 0x78) = (context->s512).bitcount[0];
  cmSHA512_Internal_Transform(context,(sha_word64 *)((context->s1).buffer + 0x30));
  return;
}

Assistant:

void SHA512_Internal_Last(SHA_CTX* context) {
	unsigned int	usedspace;

	usedspace = (unsigned int)((context->s512.bitcount[0] >> 3) % 128);
#if BYTE_ORDER == LITTLE_ENDIAN
	/* Convert FROM host byte order */
	REVERSE64(context->s512.bitcount[0],context->s512.bitcount[0]);
	REVERSE64(context->s512.bitcount[1],context->s512.bitcount[1]);
#endif
	if (usedspace > 0) {
		/* Begin padding with a 1 bit: */
		context->s512.buffer[usedspace++] = 0x80;

		if (usedspace <= 112) {
			/* Set-up for the last transform: */
			MEMSET_BZERO(&context->s512.buffer[usedspace], 112 - usedspace);
		} else {
			if (usedspace < 128) {
				MEMSET_BZERO(&context->s512.buffer[usedspace], 128 - usedspace);
			}
			/* Do second-to-last transform: */
			SHA512_Internal_Transform(context, (const sha_word64*)context->s512.buffer);

			/* And set-up for the last transform: */
			MEMSET_BZERO(context->s512.buffer, 112);
		}
		/* Clean up: */
		usedspace = 0;
	} else {
		/* Prepare for final transform: */
		MEMSET_BZERO(context->s512.buffer, 112);

		/* Begin padding with a 1 bit: */
		*context->s512.buffer = 0x80;
	}
	/* Store the length of input data (in bits): */
	MEMCPY_BCOPY(&context->s512.buffer[112], &context->s512.bitcount[1],
		     sizeof(sha_word64));
	MEMCPY_BCOPY(&context->s512.buffer[120], &context->s512.bitcount[0],
		     sizeof(sha_word64));

	/* Final transform: */
	SHA512_Internal_Transform(context, (const sha_word64*)context->s512.buffer);
}